

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O0

void stbi_decode_DXT23_alpha_block(uchar *uncompressed,uchar *compressed)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  int next_bit;
  int i;
  undefined4 local_18;
  undefined4 local_14;
  
  local_18 = 0;
  for (local_14 = 3; local_14 < 0x40; local_14 = local_14 + 4) {
    iVar1 = stbi_convert_bit_range
                      ((int)(uint)*(byte *)(in_RSI + (local_18 >> 3)) >> ((byte)local_18 & 7) & 0xf,
                       4,8);
    *(char *)(in_RDI + local_14) = (char)iVar1;
    local_18 = local_18 + 4;
  }
  return;
}

Assistant:

void stbi_decode_DXT23_alpha_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int i, next_bit = 0;
	//	each alpha value gets 4 bits
	for( i = 3; i < 16*4; i += 4 )
	{
		uncompressed[i] = stbi_convert_bit_range(
				(compressed[next_bit>>3] >> (next_bit&7)) & 15,
				4, 8 );
		next_bit += 4;
	}
}